

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.h
# Opt level: O1

void blake2s128_test(void *key,int len,uint32_t seed,void *out)

{
  blake2s_init(&ltc_state,0x10,(uchar *)0x0,0);
  ltc_state.blake2s.h[0] = seed ^ 0x6a09e667;
  blake2s_process(&ltc_state,(uchar *)key,(long)len);
  blake2s_done(&ltc_state,(uchar *)out);
  return;
}

Assistant:

inline void blake2s128_test(const void * key, int len, uint32_t seed, void * out)
{
  // objsize
  blake2s_init(&ltc_state, 16, NULL, 0);
  ltc_state.blake2s.h[0] = 0x6A09E667UL ^ seed;
  blake2s_process(&ltc_state, (unsigned char *)key, len);
  blake2s_done(&ltc_state, (unsigned char *)out);
}